

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

int CivetServer::authHandler(mg_connection *conn,void *cbdata)

{
  void *pvVar1;
  byte bVar2;
  mg_request_info *pmVar3;
  mapped_type *pmVar4;
  uint uVar5;
  mg_connection *local_40;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  local_40 = conn;
  pmVar3 = mg_get_request_info(conn);
  pvVar1 = pmVar3->user_data;
  uVar5 = 0;
  if (*(mg_context **)((long)pvVar1 + 8) != (mg_context *)0x0) {
    mg_lock_context(*(mg_context **)((long)pvVar1 + 8));
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pmVar4 = std::
             map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
             ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                           *)((long)pvVar1 + 0x10),&local_40);
    std::vector<char,_std::allocator<char>_>::_M_move_assign(&pmVar4->postData,&local_38);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
    mg_unlock_context(*(mg_context **)((long)pvVar1 + 8));
    uVar5 = 0;
    if (cbdata != (void *)0x0) {
      bVar2 = (**(code **)(*cbdata + 0x10))(cbdata,pvVar1,local_40);
      uVar5 = (uint)bVar2;
    }
  }
  return uVar5;
}

Assistant:

int
CivetServer::authHandler(struct mg_connection *conn, void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	mg_lock_context(me->context);
	me->connections[conn] = CivetConnection();
	mg_unlock_context(me->context);

	CivetAuthHandler *handler = (CivetAuthHandler *)cbdata;

	if (handler) {
		return handler->authorize(me, conn) ? 1 : 0;
	}

	return 0; // No handler found
}